

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

int lws_protocol_init(lws_context *context)

{
  int iVar1;
  lws_log_cx *plVar2;
  int local_28;
  int local_24;
  int r;
  int any;
  lws_vhost *vh;
  lws_context *context_local;
  
  _r = context->vhost_list;
  local_24 = 0;
  local_28 = 0;
  if ((*(ushort *)&context->field_0x7b7 >> 7 & 1) == 0) {
    *(ushort *)&context->field_0x7b7 = *(ushort *)&context->field_0x7b7 & 0xff7f | 0x80;
    vh = (lws_vhost *)context;
    plVar2 = lwsl_context_get_cx(context);
    _lws_log_cx(plVar2,lws_log_prepend_context,vh,8,"lws_protocol_init","\n");
    for (; _r != (lws_vhost *)0x0; _r = _r->vhost_next) {
      if (((((byte)_r->field_0x368 >> 1 & 1) == 0) && ((_r->options & 0x2000000) != 0x2000000)) &&
         (iVar1 = lws_protocol_init_vhost(_r,&local_24), iVar1 != 0)) {
        plVar2 = lwsl_vhost_get_cx(_r);
        _lws_log_cx(plVar2,lws_log_prepend_vhost,_r,2,"lws_protocol_init","init vhost %s failed",
                    _r->name);
        local_28 = -1;
      }
    }
    *(ushort *)(vh[2].http.http_proxy_address + 0x2f) =
         *(ushort *)(vh[2].http.http_proxy_address + 0x2f) & 0xff7f;
    if (local_28 != 0) {
      plVar2 = lwsl_context_get_cx((lws_context *)vh);
      _lws_log_cx(plVar2,lws_log_prepend_context,vh,2,"lws_protocol_init",
                  "some protocols did not init");
    }
    if ((*(ushort *)(vh[2].http.http_proxy_address + 0x2f) >> 6 & 1) == 0) {
      *(ushort *)(vh[2].http.http_proxy_address + 0x2f) =
           *(ushort *)(vh[2].http.http_proxy_address + 0x2f) & 0xffbf | 0x40;
      lws_finalize_startup((lws_context *)vh);
    }
    else if (local_24 != 0) {
      lws_tls_check_all_cert_lifetimes((lws_context *)vh);
    }
  }
  return 0;
}

Assistant:

int
lws_protocol_init(struct lws_context *context)
{
	struct lws_vhost *vh = context->vhost_list;
	int any = 0, r = 0;

	if (context->doing_protocol_init)
		return 0;

	context->doing_protocol_init = 1;

	lwsl_cx_info(context, "\n");

	while (vh) {

		/* only do the protocol init once for a given vhost */
		if (vh->created_vhost_protocols ||
		    (lws_check_opt(vh->options, LWS_SERVER_OPTION_SKIP_PROTOCOL_INIT)))
			goto next;

		if (lws_protocol_init_vhost(vh, &any)) {
			lwsl_vhost_warn(vh, "init vhost %s failed", vh->name);
			r = -1;
		}
next:
		vh = vh->vhost_next;
	}

	context->doing_protocol_init = 0;

	if (r)
		lwsl_cx_warn(context, "some protocols did not init");

	if (!context->protocol_init_done) {

		context->protocol_init_done = 1;
		lws_finalize_startup(context);

		return 0;
	}

#if defined(LWS_WITH_SERVER)
	if (any) {
		lws_tls_check_all_cert_lifetimes(context);
	}
#endif

	return 0;
}